

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.cpp
# Opt level: O3

void __thiscall
Js::ConstructorCache::Populate
          (ConstructorCache *this,DynamicType *type,ScriptContext *scriptContext,
          bool ctorHasNoExplicitReturnValue,bool updateAfterCtor)

{
  undefined1 *puVar1;
  byte bVar2;
  DynamicTypeHandler *pDVar3;
  code *pcVar4;
  bool bVar5;
  ScriptContext *pSVar6;
  undefined4 *puVar7;
  
  pSVar6 = Js::Type::GetScriptContext(&type->super_Type);
  if (pSVar6 != scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x33,"(scriptContext == type->GetScriptContext())",
                                "scriptContext == type->GetScriptContext()");
    if (!bVar5) goto LAB_0095d283;
    *puVar7 = 0;
  }
  if (type->isShared == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x34,"(type->GetIsShared())","type->GetIsShared()");
    if (!bVar5) goto LAB_0095d283;
    *puVar7 = 0;
  }
  bVar5 = IsConsistent(this);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x35,"(IsConsistent())","IsConsistent()");
    if (!bVar5) goto LAB_0095d283;
    *puVar7 = 0;
  }
  bVar2 = (this->content).field_0x14;
  if (((bVar2 >> 1 | ~bVar2) & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x36,"(!this->content.isPopulated || this->content.isPolymorphic)",
                                "!this->content.isPopulated || this->content.isPolymorphic");
    if (!bVar5) goto LAB_0095d283;
    *puVar7 = 0;
  }
  if (0xffff < ((type->typeHandler).ptr)->slotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x37,"(type->GetTypeHandler()->GetSlotCapacity() <= 65535)",
                                "type->GetTypeHandler()->GetSlotCapacity() <= MaxCachedSlotCount");
    if (!bVar5) goto LAB_0095d283;
    *puVar7 = 0;
  }
  puVar1 = &(this->content).field_0x14;
  *puVar1 = *puVar1 | 1;
  PropertyGuard::SetValue(&this->super_PropertyGuard,(intptr_t)type);
  Memory::Recycler::WBSetBit((char *)&this->content);
  (this->content).scriptContext.ptr = scriptContext;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->content);
  pDVar3 = (type->typeHandler).ptr;
  (this->content).slotCount = pDVar3->slotCapacity;
  (this->content).inlineSlotCount = pDVar3->inlineSlotCapacity;
  (this->content).field_0x14 = (this->content).field_0x14 & 0xf7 | ctorHasNoExplicitReturnValue << 3
  ;
  (this->content).updateAfterCtor = updateAfterCtor;
  bVar5 = IsConsistent(this);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x3f,"(IsConsistent())","IsConsistent()");
    if (!bVar5) {
LAB_0095d283:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

void ConstructorCache::Populate(DynamicType* type, ScriptContext* scriptContext, bool ctorHasNoExplicitReturnValue, bool updateAfterCtor)
    {
        Assert(scriptContext == type->GetScriptContext());
        Assert(type->GetIsShared());
        Assert(IsConsistent());
        Assert(!this->content.isPopulated || this->content.isPolymorphic);
        Assert(type->GetTypeHandler()->GetSlotCapacity() <= MaxCachedSlotCount);
        this->content.isPopulated = true;
        this->SetValue((intptr_t)type);
        this->content.scriptContext = scriptContext;
        this->content.slotCount = type->GetTypeHandler()->GetSlotCapacity();
        this->content.inlineSlotCount = type->GetTypeHandler()->GetInlineSlotCapacity();
        this->content.ctorHasNoExplicitReturnValue = ctorHasNoExplicitReturnValue;
        this->content.updateAfterCtor = updateAfterCtor;
        Assert(IsConsistent());
    }